

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::StreamingWindowState::LeadLagState::LeadLagState
          (LeadLagState *this,ClientContext *context,BoundWindowExpression *wexpr)

{
  LogicalType *other;
  Value *this_00;
  Vector *this_01;
  idx_t iVar1;
  reference this_02;
  type expression;
  idx_t iVar2;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  this->wexpr = wexpr;
  this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&wexpr->children,0);
  expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_02);
  ExpressionExecutor::ExpressionExecutor(&this->executor,context,expression);
  LogicalType::LogicalType(&local_48,SQLNULL);
  this_00 = &this->dflt;
  Value::Value(this_00,&local_48);
  LogicalType::~LogicalType(&local_48);
  DataChunk::DataChunk(&this->curr_chunk);
  other = &(wexpr->super_Expression).return_type;
  LogicalType::LogicalType(&local_60,other);
  this_01 = &this->prev;
  Vector::Vector(this_01,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  LogicalType::LogicalType(&local_78,other);
  Vector::Vector(&this->temp,&local_78,0x800);
  LogicalType::~LogicalType(&local_78);
  ComputeOffset(context,wexpr,&this->offset);
  ComputeDefault(context,wexpr,this_00);
  iVar1 = this->offset;
  iVar2 = -iVar1;
  if (0 < (long)iVar1) {
    iVar2 = iVar1;
  }
  this->buffered = iVar2;
  Vector::Reference(this_01,this_00);
  Vector::Flatten(this_01,this->buffered);
  Vector::Initialize(&this->temp,false,this->buffered);
  return;
}

Assistant:

LeadLagState(ClientContext &context, BoundWindowExpression &wexpr)
		    : wexpr(wexpr), executor(context, *wexpr.children[0]), prev(wexpr.return_type), temp(wexpr.return_type) {
			ComputeOffset(context, wexpr, offset);
			ComputeDefault(context, wexpr, dflt);

			buffered = idx_t(std::abs(offset));
			prev.Reference(dflt);
			prev.Flatten(buffered);
			temp.Initialize(false, buffered);
		}